

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

void arg_print_option_ds(arg_dstr_t ds,char *shortopts,char *longopts,char *datatype,char *suffix)

{
  char *str;
  char syntax [200];
  char *in_stack_fffffffffffffef8;
  char local_f8 [200];
  
  memset(local_f8,0,200);
  str = "";
  if (suffix != (char *)0x0) {
    str = suffix;
  }
  arg_cat_optionv(local_f8,(size_t)shortopts,longopts,datatype,(char *)0x0,0x10dda9,
                  in_stack_fffffffffffffef8);
  arg_dstr_cat(ds,local_f8);
  arg_dstr_cat(ds,str);
  return;
}

Assistant:

void arg_print_option_ds(arg_dstr_t ds, const char* shortopts, const char* longopts, const char* datatype, const char* suffix) {
    char syntax[200] = "";
    suffix = suffix ? suffix : "";

    /* there is no way of passing the proper optvalue for optional argument values here, so we must ignore it */
    arg_cat_optionv(syntax, sizeof(syntax) - 1, shortopts, longopts, datatype, 0, "|");

    arg_dstr_cat(ds, syntax);
    arg_dstr_cat(ds, (char*)suffix);
}